

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Reader * __thiscall Reader::compile(Reader *this)

{
  Ant *pAVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  Command *pCVar8;
  undefined8 uVar9;
  ulong uVar10;
  Ant *this_00;
  vector<Gate,_std::allocator<Gate>_> *gates;
  string current;
  string arg;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  vector<Pheromone,_std::allocator<Pheromone>_> *local_f0;
  undefined1 local_e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  pointer local_b0;
  pointer local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<int,_std::allocator<int>_> *local_78;
  vector<Gate,_std::allocator<Gate>_> *local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_f0 = &this->phrs;
  gates = &this->gts;
  local_78 = &this->stack;
  local_70 = gates;
  do {
    this_00 = (this->nts).super__Vector_base<Ant,_std::allocator<Ant>_>._M_impl.
              super__Vector_impl_data._M_start;
    pAVar1 = (this->nts).super__Vector_base<Ant,_std::allocator<Ant>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
    } while (this_00 == pAVar1);
    do {
      Ant::step(this_00,&this->wls,local_f0,gates);
      uVar6 = (ulong)this_00->y;
      if ((long)uVar6 < 0) {
        return this;
      }
      pbVar2 = (this->lns).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->lns).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar6) {
        return this;
      }
      uVar10 = (ulong)this_00->x;
      if ((long)uVar10 < 0) {
        return this;
      }
      if (pbVar2[uVar6]._M_string_length <= uVar10) {
        return this;
      }
      local_110.field_2._M_local_buf[0] = pbVar2[uVar6]._M_dataplus._M_p[uVar10];
      local_110._M_string_length = 1;
      local_110.field_2._M_local_buf[1] = '\0';
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_110,"q");
      if (iVar5 == 0) {
        bVar3 = false;
      }
      else {
        iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_110,"z");
        if (iVar5 == 0) {
          bVar3 = true;
          if ((this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish[-1] == 0) {
            Ant::updatePh(this_00,&this->wls,local_f0,gates);
          }
        }
        else {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_68,"[A-Za-z]",
                     0x10);
          local_e8._16_8_ = (pointer)0x0;
          local_e8._24_8_ = (char *)0x0;
          local_e8._0_8_ = (pointer)0x0;
          local_e8._8_8_ = (pointer)0x0;
          bVar4 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )local_110._M_dataplus._M_p,
                             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(local_110._M_dataplus._M_p + local_110._M_string_length),
                             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_e8,
                             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_68,0);
          if ((pointer)local_e8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_e8._0_8_,local_e8._16_8_ - local_e8._0_8_);
          }
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_68);
          bVar3 = true;
          gates = local_70;
          if (bVar4) {
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_68,local_110._M_dataplus._M_p,
                       local_110._M_dataplus._M_p + local_110._M_string_length);
            gates = local_70;
            Ant::step(this_00,&this->wls,local_f0,local_70);
            lVar7 = (long)this_00->y;
            pbVar2 = (this->lns).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(0 < lVar7) <
                (ulong)((long)(this->lns).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
              uVar6 = (ulong)this_00->x;
              if (pbVar2[lVar7]._M_string_length <= (ulong)(0 < (long)uVar6)) goto LAB_0010534b;
              if (pbVar2[lVar7]._M_string_length <= uVar6) {
LAB_0010549e:
                uVar9 = std::__throw_out_of_range_fmt
                                  (
                                  "basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                  );
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_98._M_dataplus._M_p != &local_98.field_2) {
                  operator_delete(local_98._M_dataplus._M_p,
                                  CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                           local_98.field_2._M_local_buf[0]) + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_48);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p != &local_68.field_2) {
                  operator_delete(local_68._M_dataplus._M_p,
                                  local_68.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_dataplus._M_p != &local_110.field_2) {
                  operator_delete(local_110._M_dataplus._M_p,
                                  CONCAT62(local_110.field_2._M_allocated_capacity._2_6_,
                                           CONCAT11(local_110.field_2._M_local_buf[1],
                                                    local_110.field_2._M_local_buf[0])) + 1);
                }
                _Unwind_Resume(uVar9);
              }
              local_e8._8_8_ = (pointer)0x1;
              local_e8[0x11] = 0;
              local_e8[0x10] = pbVar2[lVar7]._M_dataplus._M_p[uVar6];
              local_e8._0_8_ = (pointer)(local_e8 + 0x10);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&local_110,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_e8);
              if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
                operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
              }
              local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              local_98._M_string_length = 0;
              local_98.field_2._M_local_buf[0] = '\0';
              while( true ) {
                iVar5 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_110,"`");
                if (iVar5 == 0) break;
                Ant::step(this_00,&this->wls,local_f0,gates);
                pbVar2 = (this->lns).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (((ulong)((long)(this->lns).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)
                     <= (ulong)(0 < (long)this_00->y)) ||
                   (pbVar2[this_00->y]._M_string_length <= (ulong)(0 < this_00->x))) {
LAB_00105353:
                  bVar3 = false;
                  goto LAB_001053f1;
                }
                iVar5 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_110,";");
                if (iVar5 == 0) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_48,&local_98);
                  local_e8._8_8_ = (pointer)0x0;
                  local_e8._16_8_ = local_e8._16_8_ & 0xffffffffffffff00;
                  local_e8._0_8_ = (pointer)(local_e8 + 0x10);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&local_98,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_e8);
                  if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
                    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
                  }
                }
                else {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_98,local_110._M_dataplus._M_p,local_110._M_string_length);
                }
                lVar7 = (long)this_00->y;
                pbVar2 = (this->lns).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(this->lns).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <=
                    (ulong)(0 < lVar7)) goto LAB_00105353;
                uVar6 = (ulong)this_00->x;
                if (pbVar2[lVar7]._M_string_length <= (ulong)(0 < (long)uVar6)) goto LAB_00105353;
                if (pbVar2[lVar7]._M_string_length <= uVar6) {
                  std::__throw_out_of_range_fmt
                            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
                  goto LAB_0010549e;
                }
                local_e8._8_8_ = (pointer)0x1;
                local_e8[0x11] = 0;
                local_e8[0x10] = pbVar2[lVar7]._M_dataplus._M_p[uVar6];
                local_e8._0_8_ = (pointer)(local_e8 + 0x10);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&local_110,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_e8);
                if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
                  operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_48,&local_98);
              Command::Command((Command *)local_e8,&local_68,&local_48,local_78);
              pCVar8 = Command::execute((Command *)local_e8);
              std::vector<int,_std::allocator<int>_>::operator=(local_78,&pCVar8->stack);
              if (local_b0 != (pointer)0x0) {
                operator_delete(local_b0,(long)local_a0 - (long)local_b0);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_c8);
              if ((pointer)local_e8._0_8_ != (pointer)(local_e8 + 0x10)) {
                operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
              }
              bVar3 = true;
LAB_001053f1:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,
                                CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                         local_98.field_2._M_local_buf[0]) + 1);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_48);
            }
            else {
LAB_0010534b:
              bVar3 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT62(local_110.field_2._M_allocated_capacity._2_6_,
                                 CONCAT11(local_110.field_2._M_local_buf[1],
                                          local_110.field_2._M_local_buf[0])) + 1);
      }
      if (!bVar3) {
        return this;
      }
      this_00 = this_00 + 1;
    } while (this_00 != pAVar1);
  } while( true );
}

Assistant:

Reader& compile() {
            while (true) {
                for (Ant & ant : nts) {
                    ant.step(wls, phrs, gts);
                    if (0 > ant.y || ant.y >= lns.size() || 0 > ant.x || ant.x >= lns[ant.y].size())
                        return *this;
                    string current(1, lns[ant.y].at(ant.x));
                    if (current == "q") return *this;
                    else if (current == "z") {
                        if (stack[stack.size() - 1] == 0) { ant.updatePh(wls, phrs, gts); }
                    }
                    else if (regex_match(current, regex("[A-Za-z]"))) {
                        string name = current;
                        ant.step(wls, phrs, gts);
                        if (0 < ant.y >= lns.size() || 0 < ant.x >= lns[ant.y].size())
                            return *this;
                        current = string(1, lns[ant.y].at(ant.x));
                        vector<string> args;
                        string arg;
                        while (current != "`") {
                            ant.step(wls, phrs, gts);
                            if (0 < ant.y >= lns.size() || 0 < ant.x >= lns[ant.y].size())
                                return *this;
                            if (current == ";") {
                                args.push_back(arg);
                                arg = string();
                            } else
                                arg.append(current);
                            if (0 < ant.y >= lns.size() || 0 < ant.x >= lns[ant.y].size())
                                return *this;
                            current = string(1, lns[ant.y].at(ant.x));
                        } args.push_back(arg);
                        stack = Command(name, args, stack).execute().getStack();
                    }
                }
            }
        }